

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

size_t anon_unknown.dwarf_48c61e::cmFileCommandCurlDebugCallback
                 (CURL *param_1,curl_infotype type,char *chPtr,size_t size,void *data)

{
  int iVar1;
  char local_b8 [4];
  int n;
  char buf [128];
  cmFileCommandVectorOfChar *vec;
  void *data_local;
  size_t size_local;
  char *chPtr_local;
  curl_infotype type_local;
  CURL *param_0_local;
  
  buf._120_8_ = data;
  if (type < CURLINFO_DATA_IN) {
    cmAppend<char,char*>((vector<char,_std::allocator<char>_> *)data,chPtr,chPtr + size);
  }
  else if ((type - CURLINFO_DATA_IN < 4) &&
          (iVar1 = sprintf(local_b8,"[%lu bytes data]\n",size), 0 < iVar1)) {
    cmAppend<char,char*>
              ((vector<char,_std::allocator<char>_> *)buf._120_8_,local_b8,local_b8 + iVar1);
  }
  return 0;
}

Assistant:

size_t cmFileCommandCurlDebugCallback(CURL*, curl_infotype type, char* chPtr,
                                      size_t size, void* data)
{
  cmFileCommandVectorOfChar& vec =
    *static_cast<cmFileCommandVectorOfChar*>(data);
  switch (type) {
    case CURLINFO_TEXT:
    case CURLINFO_HEADER_IN:
    case CURLINFO_HEADER_OUT:
      cmAppend(vec, chPtr, chPtr + size);
      break;
    case CURLINFO_DATA_IN:
    case CURLINFO_DATA_OUT:
    case CURLINFO_SSL_DATA_IN:
    case CURLINFO_SSL_DATA_OUT: {
      char buf[128];
      int n = sprintf(buf, "[%" KWIML_INT_PRIu64 " bytes data]\n",
                      static_cast<KWIML_INT_uint64_t>(size));
      if (n > 0) {
        cmAppend(vec, buf, buf + n);
      }
    } break;
    default:
      break;
  }
  return 0;
}